

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O1

el_status_t do_insert_hist(char *p)

{
  el_status_t eVar1;
  
  if (p != (char *)0x0) {
    clear_line();
    rl_point = 0;
    reposition(-1);
    rl_end = 0;
    eVar1 = insert_string(p);
    return eVar1;
  }
  tty_put('\a');
  tty_flush();
  return CSstay;
}

Assistant:

static el_status_t do_insert_hist(const char *p)
{
    if (p == NULL)
        return el_ring_bell();

    clear_line();

    rl_point = 0;
    reposition(EOF);
    rl_end = 0;

    return insert_string(p);
}